

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QBspTree::Node>::resize_internal(QList<QBspTree::Node> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QGenericArrayOps<QBspTree::Node> *this_00;
  __off_t __length;
  QArrayDataPointer<QBspTree::Node> *in_RSI;
  QArrayDataPointer<QBspTree::Node> *in_RDI;
  QArrayDataPointer<QBspTree::Node> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QBspTree::Node> *this_01;
  QArrayDataPointer<QBspTree::Node> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QBspTree::Node> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QBspTree::Node> *__file;
  
  QArrayDataPointer<QBspTree::Node>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QBspTree::Node>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QBspTree::Node> *)capacity((QList<QBspTree::Node> *)0x830681);
    qVar2 = QArrayDataPointer<QBspTree::Node>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QBspTree::Node> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QGenericArrayOps<QBspTree::Node> *)
                QArrayDataPointer<QBspTree::Node>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QBspTree::Node>::truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QBspTree::Node>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (Node **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}